

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeWithCachedSizes
          (MessageGenerator *this,Printer *printer)

{
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
    io::Printer::Print(printer,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n  _extensions_.SerializeMessageSetWithCachedSizes(output);\n"
                       ,"classname",&this->classname_);
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,
                         "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n      unknown_fields(), output);\n"
                        );
    }
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(printer);
    GenerateSerializeWithCachedSizesBody(this,printer,false);
    io::Printer::Outdent(printer);
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "void $classname$::SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const {\n"
      "  _extensions_.SerializeMessageSetWithCachedSizes(output);\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n"
        "      unknown_fields(), output);\n");
    }
    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "void $classname$::SerializeWithCachedSizes(\n"
    "    ::google::protobuf::io::CodedOutputStream* output) const {\n",
    "classname", classname_);
  printer->Indent();

  GenerateSerializeWithCachedSizesBody(printer, false);

  printer->Outdent();
  printer->Print(
    "}\n");
}